

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  counting_iterator cVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  size_t sVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  _Distance __n;
  ulong uVar16;
  bool bVar17;
  
  uVar9 = this->num_digits_;
  uVar10 = this->exp_;
  lVar15 = (long)(int)uVar9;
  uVar13 = uVar10 + uVar9;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    lVar8 = (this->specs_).precision - lVar15;
    if ((int)lVar8 < 1) {
      lVar8 = 0;
    }
    bVar17 = (uVar1 >> 0x15 & 1) == 0;
    if (bVar17) {
      lVar8 = 0;
    }
    lVar11 = it.count_ - (bVar17 && (int)uVar9 < 2);
    pcVar4 = this->digits_ + ~(ulong)this->digits_ + lVar11 + 2 + lVar15;
    if ((int)uVar9 < 2) {
      pcVar4 = (char *)(lVar11 + 2);
    }
    cVar5 = write_exponent<char,fmt::v6::internal::counting_iterator>
                      (uVar13 - 1,(counting_iterator)((long)pcVar4 + lVar8 + 1));
    return (counting_iterator)cVar5.count_;
  }
  if ((int)uVar10 < 0) {
    if ((int)uVar13 < 1) {
      iVar14 = -uVar13;
      if (uVar9 == 0) {
        iVar7 = (this->specs_).precision;
        iVar3 = iVar14;
        if (SBORROW4(iVar7,iVar14) != (int)(iVar7 + uVar13) < 0) {
          iVar3 = iVar7;
        }
        if (iVar7 < 0) {
          iVar3 = iVar14;
        }
        iVar14 = iVar3;
        bVar17 = (uVar1 >> 0x15 & 1) == 0;
        uVar9 = 0;
      }
      else {
        bVar17 = (uVar1 & 0x200000) == 0;
        if (0 < (int)uVar9 && (char)((uVar1 & 0x200000) >> 0x15) == '\0') {
          bVar17 = true;
          do {
            if (this->digits_[(ulong)uVar9 - 1] != '0') goto LAB_0014603b;
            bVar2 = 1 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar2);
          uVar9 = 0;
        }
      }
LAB_0014603b:
      if ((bVar17) && (uVar9 == 0 && iVar14 == 0)) {
        return (counting_iterator)(it.count_ + 1);
      }
      sVar12 = it.count_ + 3 + (ulong)(iVar14 - 1);
      if (iVar14 < 1) {
        sVar12 = it.count_ + 2;
      }
      cVar5.count_ = (long)(int)uVar9 + sVar12;
      if ((int)uVar9 < 1) {
        cVar5.count_ = sVar12;
      }
    }
    else {
      pcVar4 = this->digits_;
      uVar16 = (ulong)uVar13;
      pcVar6 = pcVar4 + uVar16 + (it.count_ - (long)pcVar4);
      if ((uVar1 >> 0x15 & 1) == 0) {
        uVar10 = uVar9 - 1;
        if ((int)uVar13 < (int)(uVar9 - 1)) {
          uVar10 = uVar13;
        }
        do {
          if (pcVar4[lVar15 + -1] != '0') {
            uVar10 = (uint)lVar15;
            break;
          }
          lVar15 = lVar15 + -1;
        } while ((long)uVar16 < lVar15);
        pcVar4 = pcVar4 + (it.count_ - (long)pcVar4) + (long)(int)uVar10;
        if ((int)uVar10 <= (int)uVar13) {
          pcVar4 = pcVar6;
        }
        return (counting_iterator)(size_t)(pcVar4 + (uVar10 != uVar13));
      }
      iVar14 = (this->specs_).precision;
      iVar7 = iVar14 - uVar9;
      cVar5.count_ = (size_t)(pcVar6 + (lVar15 - uVar16) + 1);
      if (iVar7 != 0 && (int)uVar9 <= iVar14) {
        if (0 < iVar7) {
          cVar5.count_ = (size_t)(pcVar6 + (ulong)(iVar7 - 1) + (lVar15 - uVar16) + 2);
        }
        return (counting_iterator)cVar5.count_;
      }
    }
  }
  else {
    cVar5.count_ = lVar15 + it.count_;
    if ((int)uVar9 < 1) {
      cVar5.count_ = it.count_;
    }
    cVar5.count_ = cVar5.count_ + uVar10;
    iVar14 = (this->specs_).precision;
    if ((iVar14 < 0 | (byte)(uVar1 >> 0x15) & 1) == 1) {
      if (iVar14 - uVar13 != 0 && (int)uVar13 <= iVar14) {
        return (counting_iterator)(cVar5.count_ + (iVar14 - uVar13) + 1);
      }
      return (counting_iterator)((cVar5.count_ - ((uVar1 & 0xff) == 2)) + 2);
    }
  }
  return (counting_iterator)cVar5.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }